

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O3

void __thiscall
MempoolAcceptResult::MempoolAcceptResult
          (MempoolAcceptResult *this,TxValidationState state,CFeeRate effective_feerate,
          vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
          *wtxids_fee_calculations)

{
  long lVar1;
  undefined8 uVar2;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *in_RCX;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->m_result_type = INVALID;
  uVar2 = *(undefined8 *)effective_feerate.nSatoshisPerK;
  (this->m_state).super_ValidationState<TxValidationResult>.m_mode = (int)uVar2;
  (this->m_state).super_ValidationState<TxValidationResult>.m_result = (int)((ulong)uVar2 >> 0x20);
  (this->m_state).super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&(this->m_state).super_ValidationState<TxValidationResult>.m_reject_reason.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_state).super_ValidationState<TxValidationResult>.m_reject_reason,
             *(long *)(effective_feerate.nSatoshisPerK + 8),
             *(long *)(effective_feerate.nSatoshisPerK + 0x10) +
             *(long *)(effective_feerate.nSatoshisPerK + 8));
  (this->m_state).super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&(this->m_state).super_ValidationState<TxValidationResult>.m_debug_message.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_state).super_ValidationState<TxValidationResult>.m_debug_message,
             *(long *)(effective_feerate.nSatoshisPerK + 0x28),
             *(long *)(effective_feerate.nSatoshisPerK + 0x30) +
             *(long *)(effective_feerate.nSatoshisPerK + 0x28));
  (this->m_replaced_transactions).
  super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->m_replaced_transactions
  ;
  (this->m_replaced_transactions).
  super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->m_replaced_transactions
  ;
  (this->m_replaced_transactions).
  super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->m_vsize).super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  (this->m_base_fees).super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  (this->m_effective_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._M_payload =
       (_Storage<CFeeRate,_true>)wtxids_fee_calculations;
  (this->m_effective_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._M_engaged = true;
  std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::vector
            ((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *
             )&this->m_wtxids_fee_calculations,in_RCX);
  (this->m_wtxids_fee_calculations).
  super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
  ._M_engaged = true;
  (this->m_other_wtxid).super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_engaged = false;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit MempoolAcceptResult(TxValidationState state,
                                 CFeeRate effective_feerate,
                                 const std::vector<Wtxid>& wtxids_fee_calculations)
        : m_result_type(ResultType::INVALID),
        m_state(state),
        m_effective_feerate(effective_feerate),
        m_wtxids_fee_calculations(wtxids_fee_calculations) {}